

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian-branching.hxx
# Opt level: O0

void __thiscall
lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>::setup
          (HungarianBranching<lineage::heuristics::PartitionGraph> *this)

{
  unsigned_long *puVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  runtime_error *anon_var_0;
  size_t *frame;
  size_t partitionIdx;
  unsigned_long *__args;
  pointer *__new_size;
  uint7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  size_t in_stack_ffffffffffffffc8;
  PartitionGraph *in_stack_ffffffffffffffd0;
  size_t local_20;
  size_t *local_18;
  unsigned_long *local_10;
  
  __new_size = &(in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  ProblemGraph::numberOfFrames
            (*(ProblemGraph **)
              (in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_finish[0xf]);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),(size_type)__new_size);
  local_10 = (unsigned_long *)0x0;
  while( true ) {
    __args = local_10;
    puVar1 = (unsigned_long *)
             andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
             numberOfVertices((Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)0x1c550d);
    if (puVar1 <= __args) break;
    local_20 = PartitionGraph::frameOfPartition(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8)
    ;
    local_18 = &local_20;
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  *)&(in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_end_of_storage,local_20);
    std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
              (in_RDI,__args);
    local_10 = (unsigned_long *)((long)local_10 + 1);
  }
  andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::numberOfEdges
            ((Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)0x1c55d2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffc8,(value_type_conflict4 *)(ulong)in_stack_ffffffffffffffc0);
  return;
}

Assistant:

inline void
HungarianBranching<GRAPH>::setup()
{
    partitions_.resize(this->graph_.data_.problemGraph.numberOfFrames());
    for (size_t partitionIdx = 0;
         partitionIdx < this->graph_.numberOfVertices(); ++partitionIdx) {

        try {
            const auto& frame = this->graph_.frameOfPartition(partitionIdx);
            partitions_[frame].emplace_back(partitionIdx);
        } catch (std::runtime_error&) {
            continue; // empty partitions are ignored.
        }
    }

    // initialize solution
    solution_.resize(this->graph_.numberOfEdges(), 0);
}